

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O3

void glob_initfromgui(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  char *name;
  bool bVar2;
  bool bVar3;
  int iVar4;
  t_symbol *ptVar5;
  long lVar6;
  t_symbol *dir;
  _binbuf *x;
  size_t size;
  bool bVar7;
  int iVar8;
  _namelist *p_Var9;
  int iVar10;
  t_namelist *ptVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  t_float tVar15;
  t_float tVar16;
  char *nameptr;
  char dirbuf [1000];
  char *local_420;
  char local_418 [1000];
  
  ptVar5 = atom_getsymbolarg(0,argc,argv);
  pcVar1 = ptVar5->s_name;
  tVar15 = atom_getfloatarg(1,argc,argv);
  sys_oldtclversion = (int)tVar15;
  if (argc != 0x26) {
    bug("glob_initfromgui");
  }
  lVar6 = 0;
  bVar2 = false;
  bVar3 = true;
  do {
    bVar7 = bVar3;
    iVar8 = (int)lVar6 + 1;
    iVar4 = (int)lVar6 * 0x12;
    lVar12 = 0;
    do {
      iVar13 = (int)lVar12;
      tVar15 = atom_getfloatarg(iVar4 + iVar13 + 2,argc,argv);
      iVar14 = (int)tVar15;
      tVar15 = atom_getfloatarg(iVar4 + iVar13 + 3,argc,argv);
      tVar16 = atom_getfloatarg(iVar4 + iVar13 + 4,argc,argv);
      if (((iVar14 == 0) || (iVar13 = (int)tVar15, iVar13 == 0)) ||
         (iVar10 = (int)tVar16, iVar10 == 0)) {
        iVar14 = (&sys_fontspec[0].fi_pointsize)[lVar12] * iVar8;
        iVar13 = (&sys_fontspec[0].fi_width)[lVar12] * iVar8;
        iVar10 = (&sys_fontspec[0].fi_height)[lVar12] * iVar8;
        if (!bVar2) {
          logpost((void *)0x0,4,"ignoring invalid font-metrics from GUI");
        }
        bVar2 = true;
      }
      (&sys_gotfonts[lVar6][0].fi_pointsize)[lVar12] = iVar14;
      *(int *)(lVar6 * 0x48 + 0x1eb124 + lVar12 * 4) = iVar13;
      *(int *)(lVar6 * 0x48 + 0x1eb128 + lVar12 * 4) = iVar10;
      lVar12 = lVar12 + 3;
    } while (lVar12 != 0x12);
    lVar6 = 1;
    bVar3 = false;
  } while (bVar7);
  iVar4 = sys_oktoloadfiles(0);
  if (iVar4 != 0) {
    for (ptVar11 = (pd_maininstance.pd_stuff)->st_externlist; ptVar11 != (t_namelist *)0x0;
        ptVar11 = ptVar11->nl_next) {
      iVar4 = sys_load_lib((_glist *)0x0,ptVar11->nl_string);
      if (iVar4 == 0) {
        post("%s: can\'t load library",ptVar11->nl_string);
      }
    }
    sys_oktoloadfiles(1);
  }
  if (sys_openlist == (t_namelist *)0x0) {
    ptVar11 = (t_namelist *)0x0;
  }
  else {
    p_Var9 = sys_openlist;
    do {
      name = p_Var9->nl_string;
      iVar4 = open_via_path(pcVar1,name,"",local_418,&local_420,1000,0);
      if (iVar4 < 0) {
        pd_error((void *)0x0,"%s: can\'t open",name);
      }
      else {
        close(iVar4);
        ptVar5 = gensym(local_420);
        dir = gensym(local_418);
        glob_evalfile((t_pd *)0x0,ptVar5,dir);
      }
      p_Var9 = p_Var9->nl_next;
      ptVar11 = sys_openlist;
    } while (p_Var9 != (_namelist *)0x0);
  }
  namelist_free(ptVar11);
  sys_openlist = (t_namelist *)0x0;
  p_Var9 = sys_messagelist;
  if (sys_messagelist == (t_namelist *)0x0) {
    ptVar11 = (t_namelist *)0x0;
  }
  else {
    do {
      x = binbuf_new();
      pcVar1 = p_Var9->nl_string;
      size = strlen(pcVar1);
      binbuf_text(x,pcVar1,size);
      binbuf_eval(x,(t_pd *)0x0,0,(t_atom *)0x0);
      binbuf_free(x);
      p_Var9 = p_Var9->nl_next;
      ptVar11 = sys_messagelist;
    } while (p_Var9 != (_namelist *)0x0);
  }
  namelist_free(ptVar11);
  sys_messagelist = (t_namelist *)0x0;
  return;
}

Assistant:

void glob_initfromgui(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    const char *cwd = atom_getsymbolarg(0, argc, argv)->s_name;
    t_namelist *nl;
    unsigned int i;
    int did_fontwarning = 0;
    int j;
    sys_oldtclversion = atom_getfloatarg(1, argc, argv);
    if (argc != 2 + 3 * NZOOM * NFONT)
        bug("glob_initfromgui");
    for (j = 0; j < NZOOM; j++)
        for (i = 0; i < NFONT; i++)
    {
        int size   = atom_getfloatarg(3 * (i + j * NFONT) + 2, argc, argv);
        int width  = atom_getfloatarg(3 * (i + j * NFONT) + 3, argc, argv);
        int height = atom_getfloatarg(3 * (i + j * NFONT) + 4, argc, argv);
        if (!(size && width && height))
        {
            size   = (j+1)*sys_fontspec[i].fi_pointsize;
            width  = (j+1)*sys_fontspec[i].fi_width;
            height = (j+1)*sys_fontspec[i].fi_height;
            if (!did_fontwarning)
            {
                logpost(NULL, PD_VERBOSE, "ignoring invalid font-metrics from GUI");
                did_fontwarning = 1;
            }
        }
        sys_gotfonts[j][i].fi_pointsize = size;
        sys_gotfonts[j][i].fi_width = width;
        sys_gotfonts[j][i].fi_height = height;
#if 0
            fprintf(stderr, "font (%d %d %d)\n",
                sys_gotfonts[j][i].fi_pointsize, sys_gotfonts[j][i].fi_width,
                    sys_gotfonts[j][i].fi_height);
#endif
    }
        /* load dynamic libraries specified with "-lib" args */
    if (sys_oktoloadfiles(0))
    {
        for  (nl = STUFF->st_externlist; nl; nl = nl->nl_next)
            if (!sys_load_lib(0, nl->nl_string))
                post("%s: can't load library", nl->nl_string);
        sys_oktoloadfiles(1);
    }
        /* open patches specifies with "-open" args */
    for  (nl = sys_openlist; nl; nl = nl->nl_next)
        openit(cwd, nl->nl_string);
    namelist_free(sys_openlist);
    sys_openlist = 0;
        /* send messages specified with "-send" args */
    for  (nl = sys_messagelist; nl; nl = nl->nl_next)
    {
        t_binbuf *b = binbuf_new();
        binbuf_text(b, nl->nl_string, strlen(nl->nl_string));
        binbuf_eval(b, 0, 0, 0);
        binbuf_free(b);
    }
    namelist_free(sys_messagelist);
    sys_messagelist = 0;
}